

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_int8.h
# Opt level: O2

float ncnn::lstm_dynamic_quantize_get_absmax(float *ptr,int size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  
  auVar5 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar7._16_4_ = 0x7fffffff;
  auVar7._20_4_ = 0x7fffffff;
  auVar7._24_4_ = 0x7fffffff;
  auVar7._28_4_ = 0x7fffffff;
  for (lVar4 = 0; (int)lVar4 + 7 < size; lVar4 = lVar4 + 8) {
    auVar2 = vandps_avx(auVar7,*(undefined1 (*) [32])(ptr + lVar4));
    auVar2 = vmaxps_avx(auVar5._0_32_,auVar2);
    auVar5 = ZEXT3264(auVar2);
  }
  auVar8 = vmaxps_avx(auVar5._16_16_,auVar5._0_16_);
  auVar3 = vshufpd_avx(auVar8,auVar8,3);
  auVar8 = vmaxps_avx(auVar8,auVar3);
  auVar3 = vmovshdup_avx(auVar8);
  auVar3 = vmaxss_avx(auVar8,auVar3);
  auVar8 = ZEXT816(0) << 0x40;
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  for (; (int)lVar4 + 3 < size; lVar4 = lVar4 + 4) {
    auVar1 = vandps_avx(auVar6,*(undefined1 (*) [16])(ptr + lVar4));
    auVar8 = vmaxps_avx(auVar8,auVar1);
  }
  auVar3 = vmaxss_avx(auVar3,ZEXT816(0) << 0x40);
  auVar1 = vshufpd_avx(auVar8,auVar8,3);
  auVar8 = vmaxps_avx(auVar8,auVar1);
  auVar1 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar8,auVar1);
  auVar8 = vmaxss_avx(auVar8,auVar3);
  for (; (int)lVar4 < size; lVar4 = lVar4 + 1) {
    auVar3 = vandps_avx(ZEXT416((uint)ptr[lVar4]),auVar6);
    auVar8 = vmaxss_avx(auVar3,auVar8);
  }
  return auVar8._0_4_;
}

Assistant:

static float lstm_dynamic_quantize_get_absmax(const float* ptr, int size)
{
    float absmax = 0.f;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _absmax_avx512 = _mm512_set1_ps(0.f);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        _absmax_avx512 = _mm512_max_ps(_absmax_avx512, abs512_ps(_p));
        ptr += 16;
    }
    absmax = std::max(absmax, _mm512_comp_reduce_max_ps(_absmax_avx512));
#endif // __AVX512F__
    __m256 _absmax_avx = _mm256_set1_ps(0.f);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        _absmax_avx = _mm256_max_ps(_absmax_avx, abs256_ps(_p));
        ptr += 8;
    }
    absmax = std::max(absmax, _mm256_reduce_max_ps(_absmax_avx));
#endif // __AVX__
    __m128 _absmax = _mm_set1_ps(0.f);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        _absmax = _mm_max_ps(_absmax, abs_ps(_p));
        ptr += 4;
    }
    absmax = std::max(absmax, _mm_reduce_max_ps(_absmax));
#endif // __SSE2__
    for (; i < size; i++)
    {
        absmax = std::max(absmax, (float)fabs(*ptr));
        ptr++;
    }

    return absmax;
}